

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall spvtools::opt::analysis::IntConstant::~IntConstant(IntConstant *this)

{
  IntConstant *this_local;
  
  ~IntConstant(this);
  ::operator_delete(this,0x28);
  return;
}

Assistant:

IntConstant(const Integer* ty, const std::vector<uint32_t>& w)
      : ScalarConstant(ty, w) {}